

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_console.cpp
# Opt level: O0

int AF_DObject_C_MidPrint
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int iVar1;
  FString *pFVar2;
  VMValue *pVVar3;
  char *pcVar4;
  FFont *font_00;
  char *local_90;
  char *txt;
  FFont *fnt;
  bool bold;
  FString local_40;
  FString text;
  FString font;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/c_console.cpp"
                  ,0x6d4,
                  "int AF_DObject_C_MidPrint(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if ((param->field_0).field_3.Type != '\x02') {
    __assert_fail("param[paramnum].Type == REGT_STRING",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/c_console.cpp"
                  ,0x6d4,
                  "int AF_DObject_C_MidPrint(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  pFVar2 = VMValue::s(param);
  FString::FString(&text,pFVar2);
  if (numparam < 2) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/c_console.cpp"
                  ,0x6d5,
                  "int AF_DObject_C_MidPrint(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[1].field_0.field_3.Type == '\x02') {
    pFVar2 = VMValue::s(param + 1);
    FString::FString(&local_40,pFVar2);
    if (numparam < 3) {
      pVVar3 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
      if ((pVVar3->field_0).field_3.Type != '\0') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/c_console.cpp"
                      ,0x6d6,
                      "int AF_DObject_C_MidPrint(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar3 = TArray<VMValue,_VMValue>::operator[](defaultparam,2);
      iVar1 = (pVVar3->field_0).i;
    }
    else {
      if (param[2].field_0.field_3.Type != '\0') {
        __assert_fail("(param[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/c_console.cpp"
                      ,0x6d6,
                      "int AF_DObject_C_MidPrint(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      iVar1 = param[2].field_0.i;
    }
    pcVar4 = FString::operator_cast_to_char_(&text);
    font_00 = FFont::FindFont(pcVar4);
    pcVar4 = FString::operator[](&local_40,0);
    if (*pcVar4 == '$') {
      pcVar4 = FString::operator[](&local_40,1);
      local_90 = FStringTable::operator()(&GStrings,pcVar4);
    }
    else {
      local_90 = FString::GetChars(&local_40);
    }
    if (iVar1 == 0) {
      C_MidPrint(font_00,local_90);
    }
    else {
      C_MidPrintBold(font_00,local_90);
    }
    FString::~FString(&local_40);
    FString::~FString(&text);
    return 0;
  }
  __assert_fail("param[paramnum].Type == REGT_STRING",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/c_console.cpp"
                ,0x6d5,
                "int AF_DObject_C_MidPrint(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(DObject, C_MidPrint)
{
	PARAM_PROLOGUE;
	PARAM_STRING(font);
	PARAM_STRING(text);
	PARAM_BOOL_DEF(bold);

	FFont *fnt = FFont::FindFont(font);
	const char *txt = text[0] == '$'? GStrings(&text[1]) : text.GetChars();
	if (!bold) C_MidPrint(fnt, txt);
	else C_MidPrintBold(fnt, txt);
	return 0;
}